

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_wiz.c
# Opt level: O2

void do_zecho(CHAR_DATA *ch,char *argument)

{
  ROOM_INDEX_DATA *pRVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  DESCRIPTOR_DATA **ppDVar5;
  char buffer [9216];
  char acStack_2438 [9224];
  
  if (*argument != '\0') {
    ppDVar5 = &descriptor_list;
    while (ppDVar5 = &((DESCRIPTOR_DATA *)ppDVar5)->next->next,
          (DESCRIPTOR_DATA *)ppDVar5 != (DESCRIPTOR_DATA *)0x0) {
      if (((DESCRIPTOR_DATA *)ppDVar5)->connected == 0) {
        pRVar1 = ((DESCRIPTOR_DATA *)ppDVar5)->character->in_room;
        if (((pRVar1 != (ROOM_INDEX_DATA *)0x0) && (ch->in_room != (ROOM_INDEX_DATA *)0x0)) &&
           (pRVar1->area == ch->in_room->area)) {
          colorconv(acStack_2438,argument,((DESCRIPTOR_DATA *)ppDVar5)->character);
          iVar3 = get_trust(((DESCRIPTOR_DATA *)ppDVar5)->character);
          iVar4 = get_trust(ch);
          if (iVar4 <= iVar3) {
            bVar2 = is_npc(ch);
            if (!bVar2) {
              send_to_char("zone> ",((DESCRIPTOR_DATA *)ppDVar5)->character);
            }
          }
          send_to_char(acStack_2438,((DESCRIPTOR_DATA *)ppDVar5)->character);
          send_to_char("\n\r",((DESCRIPTOR_DATA *)ppDVar5)->character);
        }
      }
    }
    return;
  }
  send_to_char("Zone echo what?\n\r",ch);
  return;
}

Assistant:

void do_zecho(CHAR_DATA *ch, char *argument)
{
	char buffer[MAX_STRING_LENGTH * 2];
	DESCRIPTOR_DATA *d;

	if (argument[0] == '\0')
	{
		send_to_char("Zone echo what?\n\r", ch);
		return;
	}

	for (d = descriptor_list; d; d = d->next)
	{
		if (d->connected == CON_PLAYING
			&& d->character->in_room != nullptr
			&& ch->in_room != nullptr
			&& d->character->in_room->area == ch->in_room->area)
		{
			colorconv(buffer, argument, d->character);

			if (get_trust(d->character) >= get_trust(ch) && !is_npc(ch))
				send_to_char("zone> ", d->character);

			send_to_char(buffer, d->character);
			send_to_char("\n\r", d->character);
		}
	}
}